

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

uint16_t * getMissingLeavesList(uint16_t *challengeC,picnic_instance_t *params)

{
  int iVar1;
  uint16_t *puVar2;
  long in_RSI;
  uint16_t *in_RDI;
  size_t i;
  size_t pos;
  uint16_t *missingLeaves;
  size_t missingLeavesSize;
  ulong local_30;
  long local_28;
  
  puVar2 = (uint16_t *)
           calloc((long)(int)((uint)*(ushort *)(in_RSI + 4) - (uint)*(byte *)(in_RSI + 10)),2);
  local_28 = 0;
  for (local_30 = 0; local_30 < *(ushort *)(in_RSI + 4); local_30 = local_30 + 1) {
    iVar1 = contains(in_RDI,(ulong)*(byte *)(in_RSI + 10),(uint16_t)local_30);
    if (iVar1 == 0) {
      puVar2[local_28] = (uint16_t)local_30;
      local_28 = local_28 + 1;
    }
  }
  return puVar2;
}

Assistant:

static uint16_t* getMissingLeavesList(uint16_t* challengeC, const picnic_instance_t* params) {
  size_t missingLeavesSize = params->num_rounds - params->num_opened_rounds;
  uint16_t* missingLeaves  = calloc(missingLeavesSize, sizeof(uint16_t));
  size_t pos               = 0;

  for (size_t i = 0; i < params->num_rounds; i++) {
    if (!contains(challengeC, params->num_opened_rounds, i)) {
      missingLeaves[pos] = i;
      pos++;
    }
  }

  return missingLeaves;
}